

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

void __thiscall
binlog::PrettyPrinter::printTimeField
          (PrettyPrinter *this,OstreamBuffer *out,char spec,BrokenDownTime *bdt,int tzoffset,
          char *tzname)

{
  OstreamBuffer *in_RCX;
  ulong uVar1;
  char in_DL;
  undefined8 in_RDI;
  int in_R8D;
  OstreamBuffer *in_R9;
  OstreamBuffer *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffd8;
  
  uVar1 = (ulong)((int)in_DL - 0x48);
  switch(uVar1) {
  case 0:
    anon_unknown.dwarf_28eb6::printTwoDigits(in_R9,0);
    break;
  default:
    detail::OstreamBuffer::operator<<(in_R9,'\0');
    detail::OstreamBuffer::operator<<(in_R9,(char)(uVar1 >> 0x38));
    break;
  case 5:
    anon_unknown.dwarf_28eb6::printTwoDigits(in_R9,0);
    break;
  case 6:
    anon_unknown.dwarf_28eb6::printNineDigits(in_RCX,in_R8D);
    break;
  case 0xb:
    anon_unknown.dwarf_28eb6::printTwoDigits(in_R9,0);
    break;
  case 0x11:
    detail::OstreamBuffer::operator<<(in_R9,0);
    break;
  case 0x12:
    detail::OstreamBuffer::operator<<(in_RCX,(char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8));
    break;
  case 0x1c:
    anon_unknown.dwarf_28eb6::printTwoDigits(in_R9,0);
    break;
  case 0x25:
    anon_unknown.dwarf_28eb6::printTwoDigits(in_R9,0);
    break;
  case 0x31:
    anon_unknown.dwarf_28eb6::printTwoDigits(in_R9,0);
    break;
  case 0x32:
    anon_unknown.dwarf_28eb6::printTimeZoneOffset(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  }
  return;
}

Assistant:

void PrettyPrinter::printTimeField(detail::OstreamBuffer& out, char spec, BrokenDownTime& bdt, int tzoffset, const char* tzname) const
{
  switch (spec)
  {
  case 'Y':
    out << bdt.tm_year + 1900;
    break;
  case 'y':
    printTwoDigits(out, bdt.tm_year % 100);
    break;
  case 'm':
    printTwoDigits(out, bdt.tm_mon + 1);
    break;
  case 'd':
    printTwoDigits(out, bdt.tm_mday);
    break;
  case 'H':
    printTwoDigits(out, bdt.tm_hour);
    break;
  case 'M':
    printTwoDigits(out, bdt.tm_min);
    break;
  case 'S':
    printTwoDigits(out, bdt.tm_sec);
    break;
  case 'z':
    printTimeZoneOffset(out, tzoffset);
    break;
  case 'Z':
    out << tzname;
    break;
  case 'N':
    printNineDigits(out, bdt.tm_nsec);
    break;
  default:
    out << '%' << spec;
    break;
  }
}